

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

string * __thiscall
toml::detail::
read_utf8_codepoint<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
          (string *__return_storage_ptr__,detail *this,
          region<std::vector<char,_std::allocator<char>_>_> *reg,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  char cVar1;
  void *this_00;
  syntax_error *psVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_379;
  location<std::vector<char,_std::allocator<char>_>_> *local_378;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_370;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  iterator local_340;
  size_type local_338;
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_330;
  allocator<char> local_311;
  string local_310;
  string local_2f0;
  undefined1 local_2c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a1;
  location<std::vector<char,_std::allocator<char>_>_> *local_2a0;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_298;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  iterator local_268;
  size_type local_260;
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  allocator<char> local_239;
  string local_238;
  string local_218;
  undefined1 local_1f2;
  anon_class_1_0_00000001 local_1f1;
  istringstream local_1f0 [7];
  anon_class_1_0_00000001 to_char;
  istringstream iss;
  uint local_70 [2];
  uint_least32_t codepoint;
  string local_60;
  string local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  location<std::vector<char,_std::allocator<char>_>_> *loc_local;
  region<std::vector<char,_std::allocator<char>_>_> *reg_local;
  string *character;
  
  str.field_2._8_8_ = reg;
  region<std::vector<char,std::allocator<char>>>::str_abi_cxx11_(&local_60,this);
  std::__cxx11::string::substr((ulong)local_40,(ulong)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::istringstream::istringstream(local_1f0,local_40,_S_in);
  this_00 = (void *)std::istream::operator>>(local_1f0,std::hex);
  std::istream::operator>>(this_00,local_70);
  local_1f2 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_70[0] < 0x80) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)local_70[0]);
  }
  else if (local_70[0] < 0x800) {
    cVar1 = read_utf8_codepoint<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
            ::anon_class_1_0_00000001::operator()(&local_1f1,local_70[0] >> 6 | 0xc0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    cVar1 = read_utf8_codepoint<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
            ::anon_class_1_0_00000001::operator()(&local_1f1,local_70[0] & 0x3f | 0x80);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
  }
  else if (local_70[0] < 0x10000) {
    if ((0xd7ff < local_70[0]) && (local_70[0] < 0xe000)) {
      local_2c9 = 1;
      psVar2 = (syntax_error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,
                 "[error] toml::read_utf8_codepoint: codepoints in the range [0xD800, 0xDFFF] are not valid UTF-8."
                 ,&local_239);
      local_298 = &local_290;
      local_2a0 = (location<std::vector<char,_std::allocator<char>_>_> *)str.field_2._8_8_;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[28],_true>
                (local_298,&local_2a0,(char (*) [28])"not a valid UTF-8 codepoint");
      local_268 = &local_290;
      local_260 = 1;
      std::
      allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_2a1);
      __l_00._M_len = local_260;
      __l_00._M_array = local_268;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_258,__l_00,&local_2a1);
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2c8);
      format_underline(&local_218,&local_238,&local_258,&local_2c8);
      syntax_error::syntax_error(psVar2,&local_218);
      local_2c9 = 0;
      __cxa_throw(psVar2,&syntax_error::typeinfo,syntax_error::~syntax_error);
    }
    if (0xd7ff < local_70[0] && local_70[0] < 0xe000) {
      __assert_fail("codepoint < 0xD800 || 0xDFFF < codepoint",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zxvnme[P]repostruct/src/../toml/toml/parser.hpp"
                    ,0x11b,
                    "std::string toml::detail::read_utf8_codepoint(const region<Container> &, const location<Container2> &) [Container = std::vector<char>, Container2 = std::vector<char>]"
                   );
    }
    cVar1 = read_utf8_codepoint<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
            ::anon_class_1_0_00000001::operator()(&local_1f1,local_70[0] >> 0xc | 0xe0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    cVar1 = read_utf8_codepoint<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
            ::anon_class_1_0_00000001::operator()(&local_1f1,local_70[0] >> 6 & 0x3f | 0x80);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    cVar1 = read_utf8_codepoint<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
            ::anon_class_1_0_00000001::operator()(&local_1f1,local_70[0] & 0x3f | 0x80);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
  }
  else {
    if (0x10ffff < local_70[0]) {
      psVar2 = (syntax_error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,
                 "[error] toml::read_utf8_codepoint: input codepoint is too large.",&local_311);
      local_370 = &local_368;
      local_378 = (location<std::vector<char,_std::allocator<char>_>_> *)str.field_2._8_8_;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[30],_true>
                (local_370,&local_378,(char (*) [30])"should be in [0x00..0x10FFFF]");
      local_340 = &local_368;
      local_338 = 1;
      std::
      allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_379);
      __l._M_len = local_338;
      __l._M_array = local_340;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_330,__l,&local_379);
      local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_398);
      format_underline(&local_2f0,&local_310,&local_330,&local_398);
      syntax_error::syntax_error(psVar2,&local_2f0);
      __cxa_throw(psVar2,&syntax_error::typeinfo,syntax_error::~syntax_error);
    }
    cVar1 = read_utf8_codepoint<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
            ::anon_class_1_0_00000001::operator()(&local_1f1,local_70[0] >> 0x12 | 0xf0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    cVar1 = read_utf8_codepoint<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
            ::anon_class_1_0_00000001::operator()(&local_1f1,local_70[0] >> 0xc & 0x3f | 0x80);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    cVar1 = read_utf8_codepoint<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
            ::anon_class_1_0_00000001::operator()(&local_1f1,local_70[0] >> 6 & 0x3f | 0x80);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    cVar1 = read_utf8_codepoint<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
            ::anon_class_1_0_00000001::operator()(&local_1f1,local_70[0] & 0x3f | 0x80);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
  }
  local_1f2 = 1;
  std::__cxx11::istringstream::~istringstream(local_1f0);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string read_utf8_codepoint(const region<Container>& reg,
              /* for err msg */ const location<Container2>& loc)
{
    const auto str = reg.str().substr(1);
    std::uint_least32_t codepoint;
    std::istringstream iss(str);
    iss >> std::hex >> codepoint;

    const auto to_char = [](const int i) noexcept -> char {
        const auto uc = static_cast<unsigned char>(i);
        return *reinterpret_cast<const char*>(std::addressof(uc));
    };

    std::string character;
    if(codepoint < 0x80) // U+0000 ... U+0079 ; just an ASCII.
    {
        character += static_cast<char>(codepoint);
    }
    else if(codepoint < 0x800) //U+0080 ... U+07FF
    {
        // 110yyyyx 10xxxxxx; 0x3f == 0b0011'1111
        character += to_char(0xC0| codepoint >> 6);
        character += to_char(0x80|(codepoint & 0x3F));
    }
    else if(codepoint < 0x10000) // U+0800...U+FFFF
    {
        if(0xD800 <= codepoint && codepoint <= 0xDFFF)
        {
            throw syntax_error(format_underline("[error] "
                "toml::read_utf8_codepoint: codepoints in the range "
                "[0xD800, 0xDFFF] are not valid UTF-8.", {{
                    std::addressof(loc), "not a valid UTF-8 codepoint"
                }}));
        }
        assert(codepoint < 0xD800 || 0xDFFF < codepoint);
        // 1110yyyy 10yxxxxx 10xxxxxx
        character += to_char(0xE0| codepoint >> 12);
        character += to_char(0x80|(codepoint >> 6 & 0x3F));
        character += to_char(0x80|(codepoint      & 0x3F));
    }
    else if(codepoint < 0x110000) // U+010000 ... U+10FFFF
    {
        // 11110yyy 10yyxxxx 10xxxxxx 10xxxxxx
        character += to_char(0xF0| codepoint >> 18);
        character += to_char(0x80|(codepoint >> 12 & 0x3F));
        character += to_char(0x80|(codepoint >> 6  & 0x3F));
        character += to_char(0x80|(codepoint       & 0x3F));
    }
    else // out of UTF-8 region
    {
        throw syntax_error(format_underline("[error] toml::read_utf8_codepoint:"
            " input codepoint is too large.",
            {{std::addressof(loc), "should be in [0x00..0x10FFFF]"}}));
    }
    return character;
}